

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion-bignum.cpp
# Opt level: O2

void __thiscall
icu_63::double_conversion::Bignum::AssignPowerUInt16(Bignum *this,uint16_t base,int power_exponent)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  uint factor;
  int shift_amount;
  bool bVar9;
  
  uVar4 = (ulong)base;
  if (power_exponent == 0) {
    AssignUInt16(this,1);
    return;
  }
  Zero(this);
  shift_amount = 0;
  while( true ) {
    factor = (uint)uVar4;
    if ((uVar4 & 1) != 0) break;
    uVar4 = (ulong)(factor >> 1);
    shift_amount = shift_amount + power_exponent;
  }
  bVar3 = 0;
  iVar1 = 0;
  for (uVar5 = uVar4; (uint)uVar5 != 0; uVar5 = (ulong)((uint)uVar5 >> 1)) {
    bVar3 = bVar3 - 1;
    iVar1 = iVar1 + power_exponent;
  }
  if (iVar1 < 0xde4) {
    iVar1 = 1;
    do {
      iVar2 = iVar1;
      iVar1 = iVar2 * 2;
    } while (iVar2 <= power_exponent);
    uVar7 = iVar2 >> 2;
    bVar8 = false;
    uVar5 = uVar4;
    while ((uVar7 != 0 && (uVar5 >> 0x20 == 0))) {
      uVar5 = uVar5 * uVar5;
      if ((uVar7 & power_exponent) != 0) {
        bVar9 = uVar5 >> (bVar3 & 0x3f) != 0;
        uVar6 = 1;
        if (!bVar9) {
          uVar6 = uVar4;
        }
        uVar5 = uVar5 * uVar6;
        bVar8 = (bool)(bVar8 | bVar9);
      }
      uVar7 = (int)uVar7 >> 1;
    }
    AssignUInt64(this,uVar5);
    if (bVar8) {
      MultiplyByUInt32(this,factor);
    }
    for (; uVar7 != 0; uVar7 = (int)uVar7 >> 1) {
      Square(this);
      if ((uVar7 & power_exponent) != 0) {
        MultiplyByUInt32(this,factor);
      }
    }
    ShiftLeft(this,shift_amount);
    return;
  }
  abort();
}

Assistant:

void Bignum::AssignPowerUInt16(uint16_t base, int power_exponent) {
  ASSERT(base != 0);
  ASSERT(power_exponent >= 0);
  if (power_exponent == 0) {
    AssignUInt16(1);
    return;
  }
  Zero();
  int shifts = 0;
  // We expect base to be in range 2-32, and most often to be 10.
  // It does not make much sense to implement different algorithms for counting
  // the bits.
  while ((base & 1) == 0) {
    base >>= 1;
    shifts++;
  }
  int bit_size = 0;
  int tmp_base = base;
  while (tmp_base != 0) {
    tmp_base >>= 1;
    bit_size++;
  }
  int final_size = bit_size * power_exponent;
  // 1 extra bigit for the shifting, and one for rounded final_size.
  EnsureCapacity(final_size / kBigitSize + 2);

  // Left to Right exponentiation.
  int mask = 1;
  while (power_exponent >= mask) mask <<= 1;

  // The mask is now pointing to the bit above the most significant 1-bit of
  // power_exponent.
  // Get rid of first 1-bit;
  mask >>= 2;
  uint64_t this_value = base;

  bool delayed_multipliciation = false;
  const uint64_t max_32bits = 0xFFFFFFFF;
  while (mask != 0 && this_value <= max_32bits) {
    this_value = this_value * this_value;
    // Verify that there is enough space in this_value to perform the
    // multiplication.  The first bit_size bits must be 0.
    if ((power_exponent & mask) != 0) {
      uint64_t base_bits_mask =
          ~((static_cast<uint64_t>(1) << (64 - bit_size)) - 1);
      bool high_bits_zero = (this_value & base_bits_mask) == 0;
      if (high_bits_zero) {
        this_value *= base;
      } else {
        delayed_multipliciation = true;
      }
    }
    mask >>= 1;
  }
  AssignUInt64(this_value);
  if (delayed_multipliciation) {
    MultiplyByUInt32(base);
  }

  // Now do the same thing as a bignum.
  while (mask != 0) {
    Square();
    if ((power_exponent & mask) != 0) {
      MultiplyByUInt32(base);
    }
    mask >>= 1;
  }

  // And finally add the saved shifts.
  ShiftLeft(shifts * power_exponent);
}